

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O0

void __thiscall testing::internal::RE::Init(RE *this,char *regex)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  Message *pMVar5;
  char *message;
  char *in_R9;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_90;
  string local_80;
  AssertHelper local_60;
  Message local_58 [3];
  undefined1 local_40 [8];
  AssertionResult gtest_ar_;
  char *partial_regex;
  char *full_pattern;
  size_t full_regex_len;
  char *regex_local;
  RE *this_local;
  
  full_regex_len = (size_t)regex;
  regex_local = (char *)this;
  pcVar3 = posix::StrDup(regex);
  *(char **)this = pcVar3;
  sVar4 = strlen((char *)full_regex_len);
  pcVar3 = (char *)operator_new__(sVar4 + 10);
  snprintf(pcVar3,sVar4 + 10,"^(%s)$",full_regex_len);
  iVar2 = regcomp((regex_t *)(this + 0x10),pcVar3,1);
  this[8] = (RE)(iVar2 == 0);
  if (((byte)this[8] & 1) != 0) {
    if (*(char *)full_regex_len == '\0') {
      local_90._M_head_impl =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)" WillOnce()" + 9);
    }
    else {
      local_90._M_head_impl =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)full_regex_len;
    }
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )local_90._M_head_impl;
    iVar2 = regcomp((regex_t *)(this + 0x50),(char *)local_90._M_head_impl,1);
    this[8] = (RE)(iVar2 == 0);
  }
  AssertionResult::AssertionResult<bool>((AssertionResult *)local_40,(bool *)(this + 8),(type *)0x0)
  ;
  bVar1 = AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    Message::Message(local_58);
    pMVar5 = Message::operator<<(local_58,(char (*) [21])"Regular expression \"");
    pMVar5 = Message::operator<<(pMVar5,(char **)&full_regex_len);
    pMVar5 = Message::operator<<(pMVar5,(char (*) [52])
                                        "\" is not a valid POSIX Extended regular expression.");
    GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_80,(internal *)local_40,(AssertionResult *)"is_valid_","false","true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/3rdparty/googletest/googletest/src/gtest-port.cc"
               ,0x2fb,message);
    AssertHelper::operator=(&local_60,pMVar5);
    AssertHelper::~AssertHelper(&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    Message::~Message(local_58);
  }
  AssertionResult::~AssertionResult((AssertionResult *)local_40);
  if (pcVar3 != (char *)0x0) {
    operator_delete__(pcVar3);
  }
  return;
}

Assistant:

void RE::Init(const char* regex) {
  pattern_ = posix::StrDup(regex);

  // Reserves enough bytes to hold the regular expression used for a
  // full match.
  const size_t full_regex_len = strlen(regex) + 10;
  char* const full_pattern = new char[full_regex_len];

  snprintf(full_pattern, full_regex_len, "^(%s)$", regex);
  is_valid_ = regcomp(&full_regex_, full_pattern, REG_EXTENDED) == 0;
  // We want to call regcomp(&partial_regex_, ...) even if the
  // previous expression returns false.  Otherwise partial_regex_ may
  // not be properly initialized can may cause trouble when it's
  // freed.
  //
  // Some implementation of POSIX regex (e.g. on at least some
  // versions of Cygwin) doesn't accept the empty string as a valid
  // regex.  We change it to an equivalent form "()" to be safe.
  if (is_valid_) {
    const char* const partial_regex = (*regex == '\0') ? "()" : regex;
    is_valid_ = regcomp(&partial_regex_, partial_regex, REG_EXTENDED) == 0;
  }
  EXPECT_TRUE(is_valid_)
      << "Regular expression \"" << regex
      << "\" is not a valid POSIX Extended regular expression.";

  delete[] full_pattern;
}